

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void RangeEnc_EncodeDirectBits(CRangeEnc *p,UInt32 value,uint numBits)

{
  int in_EDX;
  uint in_ESI;
  uint *in_RDI;
  
  do {
    *in_RDI = *in_RDI >> 1;
    in_EDX = in_EDX + -1;
    *(ulong *)(in_RDI + 2) =
         (ulong)(*in_RDI & -(in_ESI >> ((byte)in_EDX & 0x1f) & 1)) + *(long *)(in_RDI + 2);
    if (*in_RDI < 0x1000000) {
      *in_RDI = *in_RDI << 8;
      RangeEnc_ShiftLow((CRangeEnc *)CONCAT44(in_ESI,in_EDX));
    }
  } while (in_EDX != 0);
  return;
}

Assistant:

static void RangeEnc_EncodeDirectBits(CRangeEnc *p, UInt32 value, unsigned numBits)
{
  do
  {
    p->range >>= 1;
    p->low += p->range & (0 - ((value >> --numBits) & 1));
    if (p->range < kTopValue)
    {
      p->range <<= 8;
      RangeEnc_ShiftLow(p);
    }
  }
  while (numBits != 0);
}